

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

bool __thiscall
Remapper::remap_stream_output
          (Remapper *this,D3DStreamOutput *d3d_output,VulkanStreamOutput *vk_output)

{
  dxil_spv_bool dVar1;
  undefined1 local_48 [8];
  dxil_spv_vulkan_stream_output c_vk_output;
  dxil_spv_d3d_stream_output c_output;
  VulkanStreamOutput *vk_output_local;
  D3DStreamOutput *d3d_output_local;
  Remapper *this_local;
  
  c_vk_output._8_8_ = d3d_output->semantic;
  memset(local_48,0,0x10);
  if (this->output_remapper == (dxil_spv_stream_output_remapper_cb)0x0) {
    this_local._7_1_ = true;
  }
  else {
    dVar1 = (*this->output_remapper)
                      (this->output_userdata,(dxil_spv_d3d_stream_output *)&c_vk_output.buffer_index
                       ,(dxil_spv_vulkan_stream_output *)local_48);
    if (dVar1 == '\x01') {
      vk_output->enable = (char)c_vk_output.stride != '\0';
      vk_output->offset = local_48._0_4_;
      vk_output->stride = local_48._4_4_;
      vk_output->buffer_index = c_vk_output.offset;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool remap_stream_output(const D3DStreamOutput &d3d_output, VulkanStreamOutput &vk_output) override
	{
		dxil_spv_d3d_stream_output c_output = { d3d_output.semantic, d3d_output.semantic_index };
		dxil_spv_vulkan_stream_output c_vk_output = {};

		if (output_remapper)
		{
			if (output_remapper(output_userdata, &c_output, &c_vk_output) == DXIL_SPV_TRUE)
			{
				vk_output.enable = bool(c_vk_output.enable);
				vk_output.offset = c_vk_output.offset;
				vk_output.stride = c_vk_output.stride;
				vk_output.buffer_index = c_vk_output.buffer_index;
				return true;
			}
			else
				return false;
		}
		else
		{
			return true;
		}
	}